

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_layer.cpp
# Opt level: O1

bool __thiscall ON_Layer::Read(ON_Layer *this,ON_BinaryArchive *file)

{
  ON_Color *this_00;
  bool bVar1;
  SectionFillRule rule;
  ON_ComponentStatus OVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  wchar_t *component_name;
  ON_SectionStyle *pOVar6;
  bool bVar7;
  uchar itemid;
  int minor_version;
  bool bLocked;
  bool bVisible;
  bool noClippingPlanes;
  int layer_index;
  int render_material_index;
  int mode;
  ON_wString layer_name;
  int line_pattern_index;
  int major_version;
  int obsolete_value1;
  double x;
  short s;
  byte local_121;
  int local_120;
  bool local_11a;
  bool local_119;
  double local_118;
  int local_10c;
  int local_108;
  ON__INT32 local_104;
  ON_wString local_100;
  int local_f4;
  int local_f0;
  ON__INT32 local_ec;
  ON_Linetype local_e8;
  ON_UUID local_38;
  
  local_ec = 0;
  local_f0 = 0;
  local_120 = 0;
  local_104 = 0;
  operator=(this,&Unset);
  bVar1 = ON_BinaryArchive::Read3dmChunkVersion(file,&local_f0,&local_120);
  if ((!bVar1) || (local_f0 != 1)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
               ,0x3b0,"","ON_Layer::Read() encountered a layer written by future code.");
    return false;
  }
  bVar1 = ON_BinaryArchive::ReadInt(file,&local_104);
  if (bVar1) {
    if (local_104 == 2) {
      ON_ModelComponent::SetLockedModelComponentState(&this->super_ON_ModelComponent,true);
    }
    else if (local_104 == 1) {
      ON_ModelComponent::SetHiddenModelComponentState(&this->super_ON_ModelComponent,true);
    }
    local_10c = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
    if (bVar1) {
      bVar1 = ON_BinaryArchive::ReadInt(file,&local_10c);
    }
  }
  else {
    local_10c = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
  }
  if (bVar1 != false) {
    ON_ModelComponent::SetIndex(&this->super_ON_ModelComponent,local_10c);
    bVar1 = ON_BinaryArchive::ReadInt(file,&this->m_iges_level);
  }
  local_108 = -0x7fffffff;
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,Material,&local_108);
  }
  iVar3 = local_108;
  if ((local_108 != -0x7fffffff & bVar1) == 1) {
    if (this->m_material_index != local_108) {
      ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    }
    this->m_material_index = iVar3;
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadInt(file,&local_ec);
  }
  if (bVar1 != false) {
    bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_color);
  }
  if (bVar1 == false) {
LAB_004c49cc:
    if (bVar1 == false) goto LAB_004c4a18;
    ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_38);
    ON_BinaryArchive::ReadDouble(file,(double *)&local_e8);
    ON_BinaryArchive::ReadDouble(file,(double *)&local_e8);
    ON_wString::ON_wString(&local_100);
    bVar1 = ON_BinaryArchive::ReadString(file,&local_100);
  }
  else {
    this_00 = &this->m_color;
    iVar3 = ON_Color::Alpha(this_00);
    if (iVar3 == 0xff) {
      uVar4 = ON_Color::operator_cast_to_unsigned_int(this_00);
      uVar5 = ON_Color::operator_cast_to_unsigned_int(&ON_Color::UnsetColor);
      if ((uVar4 != uVar5) && (iVar3 = ON_BinaryArchive::Archive3dmVersion(file), iVar3 < 0x46)) {
        ON_Color::SetAlpha(this_00,0);
      }
    }
    if (bVar1 != false) {
      ON_BinaryArchive::ReadShort(file,(ON__INT16 *)&local_38);
      goto LAB_004c49cc;
    }
LAB_004c4a18:
    ON_wString::ON_wString(&local_100);
  }
  if (bVar1 != false) {
    component_name = ON_wString::operator_cast_to_wchar_t_(&local_100);
    ON_ModelComponent::SetName(&this->super_ON_ModelComponent,component_name);
  }
  if ((0 < local_120 & bVar1) != 1) goto LAB_004c4df4;
  local_119 = true;
  bVar1 = ON_BinaryArchive::ReadBool(file,&local_119);
  if (local_119 == false && bVar1) {
    ON_ModelComponent::SetHiddenModelComponentState(&this->super_ON_ModelComponent,true);
  }
  OVar2 = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
  local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
       (_func_int **)
       CONCAT62(local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object._2_6_,OVar2);
  local_119 = ON_ComponentStatus::IsHidden((ON_ComponentStatus *)&local_e8);
  local_119 = !local_119;
  if (local_120 < 2 || !bVar1) goto LAB_004c4df4;
  local_f4 = -0x7fffffff;
  bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex(file,LinePattern,&local_f4);
  iVar3 = local_f4;
  if ((local_f4 != -0x7fffffff && bVar1) && (this->m_linetype_index != local_f4)) {
    ON_ModelComponent::IncrementContentVersionNumber(&this->super_ON_ModelComponent);
    this->m_linetype_index = iVar3;
  }
  if (local_120 < 3 || !bVar1) goto LAB_004c4df4;
  bVar1 = ON_BinaryArchive::ReadColor(file,&this->m_plot_color);
  if (bVar1) {
    bVar1 = ON_BinaryArchive::ReadDouble(file,&this->m_plot_weight_mm);
  }
  if ((bVar1 == false) || (local_120 < 4)) goto LAB_004c4df4;
  local_11a = false;
  bVar1 = ON_BinaryArchive::ReadBool(file,&local_11a);
  if ((bVar1) && (local_11a == true)) {
    ON_ModelComponent::SetLockedModelComponentState(&this->super_ON_ModelComponent,true);
  }
  OVar2 = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
  local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
       (_func_int **)
       CONCAT62(local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object._2_6_,OVar2);
  local_11a = ON_ComponentStatus::IsLocked((ON_ComponentStatus *)&local_e8);
  if (local_120 < 5 || !bVar1) goto LAB_004c4df4;
  local_38.Data1 = 0;
  local_38.Data2 = 0;
  local_38.Data3 = 0;
  local_38.Data4[0] = '\0';
  local_38.Data4[1] = '\0';
  local_38.Data4[2] = '\0';
  local_38.Data4[3] = '\0';
  local_38.Data4[4] = '\0';
  local_38.Data4[5] = '\0';
  local_38.Data4[6] = '\0';
  local_38.Data4[7] = '\0';
  bVar1 = ON_BinaryArchive::ReadUuid(file,&local_38);
  if (bVar1) {
    ON_ModelComponent::SetId(&this->super_ON_ModelComponent,&local_38);
  }
  if ((5 < local_120 && bVar1) &&
     (uVar4 = ON_BinaryArchive::ArchiveOpenNURBSVersion(file), 0xbf37716 < uVar4)) {
    local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object = (_func_int **)0;
    local_e8.super_ON_ModelComponent.super_ON_Object.m_userdata_list =
         (ON_UserData *)(uchar  [8])0x0;
    bVar1 = ON_BinaryArchive::ReadUuid(file,(ON_UUID *)&local_e8);
    if (bVar1) {
      ON_ModelComponent::SetParentId(&this->super_ON_ModelComponent,(ON_UUID *)&local_e8);
      bVar1 = ON_UuidIsNotNil((ON_UUID *)&local_e8);
      if (bVar1) {
        OVar2 = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
        local_118 = (double)CONCAT62(local_118._2_6_,OVar2);
        bVar1 = ON_ComponentStatus::IsHidden((ON_ComponentStatus *)&local_118);
        if (bVar1) {
          bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent);
          this->m_extension_bits = this->m_extension_bits & 0xf9 | bVar1 << 2;
        }
        OVar2 = ON_ModelComponent::ModelComponentStatus(&this->super_ON_ModelComponent);
        local_118 = (double)CONCAT62(local_118._2_6_,OVar2);
        bVar1 = ON_ComponentStatus::IsLocked((ON_ComponentStatus *)&local_118);
        if (bVar1) {
          bVar1 = ON_ModelComponent::ParentIdIsNotNil(&this->super_ON_ModelComponent);
          this->m_extension_bits = this->m_extension_bits & 0xe7 | bVar1 << 3;
        }
      }
      bVar1 = ON_BinaryArchive::ReadBool(file,&this->m_bExpanded);
    }
  }
  if (((bVar1 == false) || (local_120 < 7)) ||
     (bVar1 = ON_RenderingAttributes::Read(&this->m_rendering_attributes,file),
     local_120 < 8 || !bVar1)) goto LAB_004c4df4;
  bVar1 = ON_BinaryArchive::ReadUuid(file,&this->m_display_material_id);
  if (local_120 == 9 && bVar1) {
    local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
         (_func_int **)
         ((ulong)local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
         0xffffffffffffff00);
    bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_e8);
    if (bVar1) {
      local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
           (_func_int **)
           ((ulong)local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object &
           0xffffffffffffff00);
      bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_e8);
    }
  }
  if ((bVar1 == false) || (local_120 < 10)) goto LAB_004c4df4;
  local_121 = 0xff;
  bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
  if (bVar1 && local_121 != 0) {
    if (local_121 == 0x1c) {
      local_118 = (double)((ulong)local_118 & 0xffffffffffffff00);
      ON_UuidList::ON_UuidList((ON_UuidList *)&local_e8);
      bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)&local_118);
      if ((bVar1) && (bVar1 = ON_UuidList::Read((ON_UuidList *)&local_e8,file), bVar1)) {
        bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
        bVar7 = local_121 != 0 && bVar1;
      }
      else {
        bVar7 = false;
      }
      ON_UuidList::~ON_UuidList((ON_UuidList *)&local_e8);
      if (!bVar7) goto LAB_004c4dc7;
    }
    if (10 < local_120) {
      if (local_121 == 0x1d) {
        local_118 = (double)((ulong)local_118 & 0xffffffff00000000);
        bVar1 = ON_BinaryArchive::Read3dmReferencedComponentIndex
                          (file,HatchPattern,(int *)&local_118);
        if (bVar1) {
          ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_e8);
          if (this->m_private == (ON_LayerPrivate *)0x0) {
            pOVar6 = (ON_SectionStyle *)0x0;
          }
          else {
            pOVar6 = (this->m_private->m_custom_section_style).
                     super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          if (pOVar6 != (ON_SectionStyle *)0x0) {
            ON_SectionStyle::operator=((ON_SectionStyle *)&local_e8,pOVar6);
          }
          ON_SectionStyle::SetHatchIndex((ON_SectionStyle *)&local_e8,local_118._0_4_);
          SetCustomSectionStyle(this,(ON_SectionStyle *)&local_e8);
          bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
          bVar7 = local_121 != 0 && bVar1;
          ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_e8);
        }
        else {
          bVar7 = false;
        }
        if (!bVar7) goto LAB_004c4dc7;
      }
      if (local_121 == 0x1e) {
        local_118 = 1.0;
        bVar1 = ON_BinaryArchive::ReadDouble(file,&local_118);
        if (bVar1) {
          ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_e8);
          if (this->m_private == (ON_LayerPrivate *)0x0) {
            pOVar6 = (ON_SectionStyle *)0x0;
          }
          else {
            pOVar6 = (this->m_private->m_custom_section_style).
                     super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          if (pOVar6 != (ON_SectionStyle *)0x0) {
            ON_SectionStyle::operator=((ON_SectionStyle *)&local_e8,pOVar6);
          }
          ON_SectionStyle::SetHatchScale((ON_SectionStyle *)&local_e8,local_118);
          SetCustomSectionStyle(this,(ON_SectionStyle *)&local_e8);
          bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
          bVar7 = local_121 != 0 && bVar1;
          ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_e8);
        }
        else {
          bVar7 = false;
        }
        if (!bVar7) goto LAB_004c4dc7;
      }
      if (local_121 == 0x1f) {
        local_118 = 0.0;
        bVar1 = ON_BinaryArchive::ReadDouble(file,&local_118);
        if (bVar1) {
          ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_e8);
          if (this->m_private == (ON_LayerPrivate *)0x0) {
            pOVar6 = (ON_SectionStyle *)0x0;
          }
          else {
            pOVar6 = (this->m_private->m_custom_section_style).
                     super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          }
          if (pOVar6 != (ON_SectionStyle *)0x0) {
            ON_SectionStyle::operator=((ON_SectionStyle *)&local_e8,pOVar6);
          }
          ON_SectionStyle::SetHatchRotation((ON_SectionStyle *)&local_e8,local_118);
          SetCustomSectionStyle(this,(ON_SectionStyle *)&local_e8);
          bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
          bVar7 = local_121 != 0 && bVar1;
          ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_e8);
        }
        else {
          bVar7 = false;
        }
        if (!bVar7) goto LAB_004c4dc7;
      }
      if (0xb < local_120) {
        if (local_121 == 0x20) {
          local_118 = (double)((ulong)local_118 & 0xffffffffffffff00);
          bVar1 = ON_BinaryArchive::ReadChar(file,(ON__UINT8 *)&local_118);
          if (bVar1) {
            ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_e8);
            if (this->m_private == (ON_LayerPrivate *)0x0) {
              pOVar6 = (ON_SectionStyle *)0x0;
            }
            else {
              pOVar6 = (this->m_private->m_custom_section_style).
                       super___shared_ptr<ON_SectionStyle,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            }
            if (pOVar6 != (ON_SectionStyle *)0x0) {
              ON_SectionStyle::operator=((ON_SectionStyle *)&local_e8,pOVar6);
            }
            rule = ON::SectionFillRuleFromUnsigned((uint)local_118._0_1_);
            ON_SectionStyle::SetSectionFillRule((ON_SectionStyle *)&local_e8,rule);
            SetCustomSectionStyle(this,(ON_SectionStyle *)&local_e8);
            bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
            bVar7 = local_121 != 0 && bVar1;
            ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_e8);
          }
          else {
            bVar7 = false;
          }
          if (!bVar7) goto LAB_004c4dc7;
        }
        if (0xc < local_120) {
          if (local_121 == 0x21) {
            ON_Linetype::ON_Linetype(&local_e8);
            bVar1 = ON_Linetype::Read(&local_e8,file);
            if (bVar1) {
              bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
              bVar7 = local_121 != 0 && bVar1;
            }
            else {
              bVar7 = false;
            }
            ON_Linetype::~ON_Linetype(&local_e8);
            if (!bVar7) goto LAB_004c4dc7;
          }
          if (0xd < local_120) {
            if (local_121 == 0x22) {
              local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                   (_func_int **)
                   CONCAT71(local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object._1_7_,1
                           );
              bVar1 = ON_BinaryArchive::ReadBool(file,(bool *)&local_e8);
              if (bVar1) {
                SetPerViewportIsVisibleInNewDetails
                          (this,local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object.
                                _0_1_);
                bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
                bVar7 = local_121 != 0 && bVar1;
              }
              else {
                bVar7 = false;
              }
              if (!bVar7) goto LAB_004c4dc7;
            }
            if (0xe < local_120) {
              if (local_121 == 0x23) {
                ON_SectionStyle::ON_SectionStyle((ON_SectionStyle *)&local_e8);
                bVar1 = ON_SectionStyle::Read((ON_SectionStyle *)&local_e8,file);
                if (bVar1) {
                  SetCustomSectionStyle(this,(ON_SectionStyle *)&local_e8);
                  bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
                  bVar7 = local_121 != 0 && bVar1;
                }
                else {
                  bVar7 = false;
                }
                ON_SectionStyle::~ON_SectionStyle((ON_SectionStyle *)&local_e8);
                if (!bVar7) goto LAB_004c4dc7;
              }
              if (local_121 == 0x24) {
                local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object =
                     (_func_int **)
                     CONCAT71(local_e8.super_ON_ModelComponent.super_ON_Object._vptr_ON_Object._1_7_
                              ,1);
                ON_BinaryArchive::ReadBool(file,(bool *)&local_e8);
                if (bVar1 == false) {
                  bVar7 = false;
                }
                else {
                  bVar1 = ON_BinaryArchive::ReadChar(file,&local_121);
                  bVar7 = local_121 != 0 && bVar1;
                }
                if (!bVar7) goto LAB_004c4dc7;
              }
              if (0x24 < local_121) {
                local_121 = 0;
              }
            }
          }
        }
      }
    }
  }
LAB_004c4dc7:
  if ((bVar1 != false) && (local_121 != 0)) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_layer.cpp"
               ,0x39c,"","Bug in ON_Layer::Read or Write");
  }
LAB_004c4df4:
  bVar7 = ON_ModelComponent::IdIsNil(&this->super_ON_ModelComponent);
  if (bVar7) {
    ON_ModelComponent::SetId(&this->super_ON_ModelComponent);
  }
  ON_wString::~ON_wString(&local_100);
  return bVar1;
}

Assistant:

bool ON_Layer::Read(
       ON_BinaryArchive& file // restore definition from binary archive
     )
{
  int obsolete_value1 = 0; // see ON_Layer::Write
  int major_version=0;
  int minor_version=0;
  int mode = ON::normal_layer;
  *this = ON_Layer::Unset;
  bool rc = file.Read3dmChunkVersion(&major_version,&minor_version);
  if ( rc && major_version == 1 )
  {
    // common to all 1.x formats
    if ( rc ) rc = file.ReadInt( &mode );
    if ( rc ) 
    {
      switch(mode)
      {
      case 0: // OBSOLETE ON::normal_layer
        break;
      case 1: // OBSOLETE ON::hidden_layer
        SetHiddenModelComponentState(true);
        break;
      case 2: // OBSOLETE ON::locked_layer
        SetLockedModelComponentState( true );
        break;
      default:
        break;
      }
    }
    int layer_index = Index();
    if (rc)
    {
      // this is the archive layer index - it will probably change when the
      // layer is added to the model. Since the layer has not been added to
      // the model, there is not way to automatically update it at this time.
      rc = file.ReadInt(&layer_index);
    }
    if (rc)
      SetIndex(layer_index);

    if ( rc ) rc = file.ReadInt( &m_iges_level );

    // render material index
    int render_material_index = ON_UNSET_INT_INDEX;
    if (rc) 
      rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::RenderMaterial,&render_material_index);
    if (rc && ON_UNSET_INT_INDEX != render_material_index )
      SetRenderMaterialIndex(render_material_index);

    if ( rc ) rc = file.ReadInt( &obsolete_value1 );
    if ( rc ) rc = file.ReadColor( m_color );

    // 25 Aug 2021 S. Baer (RH-65410)
    // Pre-V7 files ignored alpha on layer colors and in some cases
    // alpha was being set to completely transparent. In this case,
    // make the color opaque. Even V7 files with completely transparent
    // color is strange, but it can be intentionally set for some reason
    if (rc && m_color.Alpha() == 255 && m_color != ON_Color::UnsetColor && file.Archive3dmVersion() < 70)
    {
      m_color.SetAlpha(0);
    }

    {
      // OBSOLETE line style was never used - read and discard the next 20 bytes
      short s;
      double x;
      if (rc) file.ReadShort(&s);
      if (rc) file.ReadShort(&s);
      if (rc) file.ReadDouble(&x);
      if (rc) file.ReadDouble(&x);
    }

    ON_wString layer_name;
    if ( rc ) rc = file.ReadString( layer_name );
    if (rc)
      SetName(layer_name);

    if ( rc && minor_version >= 1 )
    {
      bool bVisible = true;
      rc = file.ReadBool(&bVisible);
      if ( rc && false == bVisible)
        SetHiddenModelComponentState(true);
      bVisible = (false == ModelComponentStatus().IsHidden());

      if ( rc && minor_version >= 2 )
      {
        // line pattern index
        int line_pattern_index = ON_UNSET_INT_INDEX;
        rc = file.Read3dmReferencedComponentIndex( ON_ModelComponent::Type::LinePattern, &line_pattern_index );
        if (rc && ON_UNSET_INT_INDEX != line_pattern_index)
          SetLinetypeIndex(line_pattern_index);

        if (rc && minor_version >= 3 )
        {
          // 23 March 2005 Dale Lear
          rc = file.ReadColor( m_plot_color);
          if (rc) rc = file.ReadDouble( &m_plot_weight_mm);

          if (rc && minor_version >= 4 )
          {
            bool bLocked = false;
            rc = file.ReadBool(&bLocked);
            if (rc && bLocked )
              SetLockedModelComponentState(bLocked);
            bLocked = ModelComponentStatus().IsLocked();

            if (rc && minor_version >= 5 )
            {
              ON_UUID layer_id = ON_nil_uuid;
              rc = file.ReadUuid(layer_id);
              if (rc)
                SetId(layer_id);
              if ( rc
                   && minor_version >= 6
                   && file.ArchiveOpenNURBSVersion() > 200505110
                 )
              {
                // Some files saved with opennurbs version 200505110 
                // do not contain correctly written m_parent_layer_id
                // and m_bExpanded values.
                // It is ok to default these values.
                ON_UUID parent_layer_id = ON_nil_uuid;
                rc = file.ReadUuid(parent_layer_id);
                if (rc)
                {
                  SetParentId(parent_layer_id);
                  if ( ON_UuidIsNotNil(parent_layer_id) )
                  {
                    //SetParentId(parent_layer_id);
                    if ( ModelComponentStatus().IsHidden() )
                      SetPersistentVisibility(false);
                    if ( ModelComponentStatus().IsLocked())
                      SetPersistentLocking(true);
                  }
                  rc = file.ReadBool(&m_bExpanded);
                }
              }

              if ( rc && minor_version >= 7 )
              {
                // 1.7 field - added 6 June 2006
                rc = m_rendering_attributes.Read(file);

                if ( rc && minor_version >= 8 )
                {
                  // 1.8 field - added 19 Sep 2006
                  rc = file.ReadUuid(m_display_material_id);

                  if (rc && minor_version == 9)
                  {
                    // 1.9 field - added 11 Aug 2021 and removed on 12 Aug 2021
                    // Note above that we are looking specifically at minor_version of 9
                    // read two chars and throw them away.
                    // minor_version >= 10 should skip this entirely
                    unsigned char style = 0;
                    rc = file.ReadChar(&style);
                    if (rc)
                    {
                      style = 0;
                      rc = file.ReadChar(&style);
                    }
                  }

                  if (rc && minor_version >= 10)
                  {
                    unsigned char itemid = 0xFF;
                    while (rc)
                    {
                      rc = file.ReadChar(&itemid);
                      if (!rc) break;
                      if (0 == itemid)
                        break;

                      if (ON_LayerTypeCodes::ObsoleteSelectiveClippingData == itemid) //28
                      {
                        bool noClippingPlanes = false;
                        ON_UuidList selectiveList;
                        rc = file.ReadBool(&noClippingPlanes);
                        if (!rc) break;
                        rc = selectiveList.Read(file);
                        if (!rc) break;
                        //if (noClippingPlanes)
                        //  SetClipParticipationForNone();
                        //else if (selectiveList.Count() > 0)
                        //  SetClipParticipationList(selectiveList.Array(), selectiveList.Count(), true);
                        //else
                        //  SetClipParticipationForAll();

                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 10)
                        break;

                      if (ON_LayerTypeCodes::SectionHatchIndex == itemid) // 30
                      {
                        int pattern = 0;
                        rc = file.Read3dmReferencedComponentIndex(ON_ModelComponent::Type::HatchPattern, &pattern);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetHatchIndex(pattern);
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (ON_LayerTypeCodes::SectionHatchScale == itemid) // 31
                      {
                        double scale = 1;
                        rc = file.ReadDouble(&scale);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetHatchScale(scale);
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (ON_LayerTypeCodes::SectionHatchRotation == itemid) // 32
                      {
                        double rotation = 0;
                        rc = file.ReadDouble(&rotation);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetHatchRotation(rotation);
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 11)
                        break;

                      if (ON_LayerTypeCodes::SectionFillRule == itemid)
                      {
                        unsigned char c = 0;
                        rc = file.ReadChar(&c);
                        if (!rc) break;
                        ON_SectionStyle section_style;
                        CustomSectionStyle(&section_style);
                        section_style.SetSectionFillRule(ON::SectionFillRuleFromUnsigned(c));
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 12)
                        break;

                      if (ON_LayerTypeCodes::CustomLinetype == itemid)
                      {
                        ON_Linetype lt;
                        rc = lt.Read(file);
                        if (!rc) break;
                        // 17 Feb 2023 S. Baer
                        // Custom linetype per layer was a short lived experiment
                        // We still need to read a linetype out of the few 3dm files
                        // that have them, but we no longer set any sort of custom linetype
                        //SetCustomLinetype(lt);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 13)
                        break;

                      // visible in new detail (1.14)
                      if (ON_LayerTypeCodes::PerViewportIsVisibleInNewDetails == itemid)
                      {
                        bool b = true;
                        rc = file.ReadBool(&b);
                        if (!rc) break;
                        SetPerViewportIsVisibleInNewDetails(b);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (minor_version <= 14)
                        break;

                      if (ON_LayerTypeCodes::CustomSectionStyle == itemid)
                      {
                        ON_SectionStyle section_style;
                        rc = section_style.Read(file);
                        if (!rc) break;
                        SetCustomSectionStyle(section_style);
                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      if (ON_LayerTypeCodes::ObsoleteSelectiveClippingListType == itemid)
                      {
                        bool b = true;
                        file.ReadBool(&b);
                        if (!rc) break;
                        //if (nullptr == m_private)
                        //  m_private = new ON_LayerPrivate();
                        //m_private->m_clipplane_list_is_participation = b;

                        rc = file.ReadChar(&itemid);
                        if (!rc || 0 == itemid) break;
                      }

                      // Add new item reading above and increment the LastLayerTypeCode value
                      // in the enum. Be sure to test reading of old and new files by old and new
                      // code, before checking in your changes.
                      if (itemid > ON_LayerTypeCodes::LastLayerTypeCode)
                      {
                        // we are reading file written with code newer than this code
                        itemid = 0;
                      }

                      break;
                    }

                    if (rc && 0 != itemid)
                    {
                      ON_ERROR("Bug in ON_Layer::Read or Write");
                    }

                  }
                }
              }
            }
          }
        }
      }
    }

    if ( IdIsNil()  )
    {
      // old files didn't have layer ids and we need unique ones.
      SetId();
    }
  }
  else
  {
    ON_ERROR("ON_Layer::Read() encountered a layer written by future code.");
    rc = false;
  }

  return rc;
}